

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O2

xmlChar * xmlSchemaGetComponentQName(xmlChar **buf,void *item)

{
  xmlChar *pxVar1;
  int *piVar2;
  xmlChar *add;
  long lVar3;
  
  pxVar1 = (xmlChar *)0x0;
  piVar2 = (int *)item;
LAB_0018ac3e:
  add = pxVar1;
  if (piVar2 != (int *)0x0) {
    switch(*piVar2) {
    case 1:
      add = (xmlChar *)"http://www.w3.org/2001/XMLSchema";
    case 2:
    case 3:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x19:
      break;
    case 4:
    case 5:
      add = *(xmlChar **)(piVar2 + 0x34);
      break;
    case 0xe:
      add = *(xmlChar **)(piVar2 + 0x18);
      break;
    case 0xf:
      add = *(xmlChar **)(piVar2 + 0x1c);
      break;
    case 0x10:
      add = *(xmlChar **)(piVar2 + 0x1a);
      break;
    case 0x11:
    case 0x16:
    case 0x17:
    case 0x18:
      add = *(xmlChar **)(piVar2 + 10);
      break;
    case 0x12:
      goto switchD_0018ac57_caseD_12;
    case 0x1a:
      goto switchD_0018ac57_caseD_1a;
    default:
      if (*piVar2 != 2000) break;
switchD_0018ac57_caseD_12:
      add = *(xmlChar **)(piVar2 + 8);
    }
  }
  goto switchD_0018ac57_caseD_2;
switchD_0018ac57_caseD_1a:
  piVar2 = *(int **)(piVar2 + 6);
  add = (xmlChar *)0x0;
  if (piVar2 == (int *)0x0) goto switchD_0018ac57_caseD_2;
  goto LAB_0018ac3e;
switchD_0018acc2_caseD_1a:
  item = *(void **)((long)item + 0x18);
  if ((int *)item == (int *)0x0) {
switchD_0018acc2_caseD_2:
    pxVar1 = xmlSchemaFormatQName(buf,add,(xmlChar *)0x0);
    return pxVar1;
  }
  goto LAB_0018aca5;
switchD_0018ac57_caseD_2:
LAB_0018aca5:
  if ((int *)item == (int *)0x0) {
code_r0x00184864:
    if (*buf != (xmlChar *)0x0) {
      (*xmlFree)(*buf);
      *buf = (xmlChar *)0x0;
    }
    if (add == (xmlChar *)0x0) {
      pxVar1 = (xmlChar *)0x0;
    }
    else {
      pxVar1 = xmlStrdup((xmlChar *)"{");
      *buf = pxVar1;
      pxVar1 = xmlStrcat(pxVar1,add);
      *buf = pxVar1;
      pxVar1 = xmlStrcat(pxVar1,"}");
      *buf = pxVar1;
    }
    pxVar1 = xmlStrcat(pxVar1,(xmlChar *)"(NULL)");
    *buf = pxVar1;
    return pxVar1;
  }
  switch(*item) {
  case 1:
  case 4:
  case 5:
  case 0xe:
  case 0xf:
  case 0x10:
    lVar3 = 0x10;
    break;
  case 2:
  case 3:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x19:
    goto switchD_0018acc2_caseD_2;
  case 0x11:
  case 0x16:
  case 0x17:
  case 0x18:
    lVar3 = 0x20;
    break;
  case 0x12:
    lVar3 = 8;
    break;
  case 0x1a:
    goto switchD_0018acc2_caseD_1a;
  default:
    if (*item != 2000) goto code_r0x00184864;
    lVar3 = 0x18;
  }
  pxVar1 = xmlSchemaFormatQName(buf,add,*(xmlChar **)((long)item + lVar3));
  return pxVar1;
}

Assistant:

static const xmlChar*
xmlSchemaGetComponentQName(xmlChar **buf,
			   void *item)
{
    return (xmlSchemaFormatQName(buf,
	xmlSchemaGetComponentTargetNs((xmlSchemaBasicItemPtr) item),
	xmlSchemaGetComponentName((xmlSchemaBasicItemPtr) item)));
}